

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int anon_unknown.dwarf_28dc::forward_free_fn(void *extra_state)

{
  int iVar1;
  
  iVar1 = (**(code **)((long)extra_state + 8))(*(undefined8 *)((long)extra_state + 0x18));
  operator_delete(extra_state);
  return iVar1;
}

Assistant:

int forward_free_fn(void *extra_state) {
  grequest_state_t *const grequest_state =
      static_cast<grequest_state_t *>(extra_state);
  const int ierr = grequest_state->free_fn(grequest_state->extra_state);
  // For safety
  grequest_state->query_fn = nullptr;
  grequest_state->free_fn = nullptr;
  grequest_state->cancel_fn = nullptr;
  grequest_state->extra_state = nullptr;
  delete grequest_state;
  return ierr;
}